

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O1

void __thiscall BBDT<UF>::FirstScan(BBDT<UF> *this)

{
  int iVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar5 = (ulong)*(int *)&pMVar2->field_0x8;
  iVar1 = *(int *)&pMVar2->field_0xc;
  lVar6 = (long)iVar1;
  *UF::P_ = 0;
  UF::length_ = 1;
  if (0 < (long)uVar5) {
    uVar13 = 0;
    do {
      if (0 < iVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar14 = **(long **)&pMVar2->field_0x48;
        lVar15 = lVar14 * uVar13 + *(long *)&pMVar2->field_0x10;
        lVar16 = lVar15 - lVar14;
        lVar11 = lVar16 - lVar14;
        lVar14 = lVar14 + lVar15;
        lVar20 = **(long **)&pMVar3->field_0x48;
        lVar19 = lVar20 * uVar13 + *(long *)&pMVar3->field_0x10;
        lVar20 = lVar19 + lVar20 * -2;
        uVar17 = uVar13 | 1;
        uVar18 = 0;
        do {
          puVar4 = UF::P_;
          if (*(char *)(lVar15 + uVar18) == '\0') {
            if ((uVar17 < uVar5) && (*(char *)(lVar14 + uVar18) != '\0')) {
              uVar12 = uVar18 | 1;
              if (((long)uVar12 < lVar6) && (*(char *)(lVar15 + uVar12) != '\0')) {
                if (uVar18 != 0) {
                  if (*(char *)((uVar18 - 1) + lVar15) != '\0') {
                    if ((uVar13 == 0) || (*(char *)(lVar16 + uVar12) == '\0')) {
                      if ((uVar13 != 0) &&
                         (((long)(uVar18 + 2) < lVar6 && (*(char *)(lVar16 + uVar18 + 2) != '\0'))))
                      {
                        if (*(char *)(lVar11 + uVar12) == '\0') {
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else {
                          if (*(char *)(lVar16 + uVar18) != '\0') goto LAB_0018876b;
                          if (*(char *)(lVar11 + uVar18) == '\0') {
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else {
                            if (*(char *)(lVar16 + -1 + uVar18) != '\0') goto LAB_0018876b;
                            if (*(char *)((uVar18 - 2) + lVar16) == '\0') {
                              uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                            }
                            else {
                              if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                              uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                            }
                          }
                        }
                        goto LAB_00188b07;
                      }
                    }
                    else if (*(char *)(lVar16 + uVar18) == '\0') {
                      if (*(char *)(lVar11 + uVar18) == '\0') {
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else {
                        if (*(char *)(lVar16 + -1 + uVar18) != '\0') goto LAB_0018876b;
                        if (*(char *)((uVar18 - 2) + lVar16) == '\0') {
                          uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else {
                          if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                          uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                      }
                      goto LAB_00188b07;
                    }
                    goto LAB_0018876b;
                  }
                  if (*(char *)(lVar14 + -1 + uVar18) != '\0') {
                    if ((uVar13 == 0) || (*(char *)(lVar16 + uVar12) == '\0')) {
                      if ((uVar13 == 0) ||
                         ((lVar6 <= (long)(uVar18 + 2) || (*(char *)(lVar16 + uVar18 + 2) == '\0')))
                         ) {
                        if ((uVar13 == 0) || (*(char *)(lVar16 + uVar18) == '\0'))
                        goto LAB_0018876b;
                        if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                          uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else {
                          if (*(char *)(lVar16 + -1 + uVar18) != '\0') goto LAB_0018876b;
                          if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else {
                            if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                        }
                      }
                      else if (*(char *)(lVar11 + uVar12) == '\0') {
                        if (*(char *)(lVar16 + uVar18) != '\0') {
                          if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                            uVar10 = uVar7;
                            if (uVar9 >= uVar7 && uVar9 != uVar7) {
                              uVar10 = uVar9;
                            }
                            if (uVar9 < uVar7) {
                              uVar7 = uVar9;
                            }
                            UF::P_[uVar10] = uVar7;
                            do {
                              uVar10 = uVar7;
                              uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              uVar7 = puVar4[uVar10];
                            } while (puVar4[uVar10] < uVar10);
                            do {
                              uVar7 = uVar9;
                              uVar9 = puVar4[uVar7];
                            } while (puVar4[uVar7] < uVar7);
                          }
                          else {
                            if (*(char *)(lVar16 + -1 + uVar18) != '\0') {
                              uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                              goto LAB_00188b07;
                            }
                            if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                              uVar10 = uVar7;
                              if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                uVar10 = uVar9;
                              }
                              if (uVar9 < uVar7) {
                                uVar7 = uVar9;
                              }
                              UF::P_[uVar10] = uVar7;
                              do {
                                uVar10 = uVar7;
                                uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                uVar7 = puVar4[uVar10];
                              } while (puVar4[uVar10] < uVar10);
                              do {
                                uVar7 = uVar9;
                                uVar9 = puVar4[uVar7];
                              } while (puVar4[uVar7] < uVar7);
                            }
                            else {
                              if (*(char *)(lVar11 + -1 + uVar18) != '\0') {
                                uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                do {
                                  uVar9 = uVar7;
                                  uVar7 = UF::P_[uVar9];
                                  uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                } while (UF::P_[uVar9] < uVar9);
                                do {
                                  uVar7 = uVar10;
                                  uVar10 = UF::P_[uVar7];
                                } while (UF::P_[uVar7] < uVar7);
                                goto LAB_00188b07;
                              }
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                              uVar10 = uVar7;
                              if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                uVar10 = uVar9;
                              }
                              if (uVar9 < uVar7) {
                                uVar7 = uVar9;
                              }
                              UF::P_[uVar10] = uVar7;
                              do {
                                uVar10 = uVar7;
                                uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                uVar7 = puVar4[uVar10];
                              } while (puVar4[uVar10] < uVar10);
                              do {
                                uVar7 = uVar9;
                                uVar9 = puVar4[uVar7];
                              } while (puVar4[uVar7] < uVar7);
                            }
                          }
                          goto LAB_00188bc7;
                        }
                        uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                        uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                        if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else if (*(char *)(lVar11 + -1 + uVar18) == '\0') {
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else {
                          if ((*(char *)(lVar16 + uVar18) != '\0') ||
                             (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                      }
                      else {
                        if ((*(char *)(lVar16 + uVar18) != '\0') ||
                           (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                        uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                    }
                    else if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                    else if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                      if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else if (*(char *)(lVar11 + -1 + uVar18) == '\0') {
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else {
                        if ((*(char *)(lVar16 + uVar18) != '\0') ||
                           (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                    }
                    else {
                      if ((*(char *)(lVar16 + uVar18) != '\0') ||
                         (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                    goto LAB_00188b07;
                  }
                }
                if ((uVar13 == 0) || (*(char *)(lVar16 + uVar12) == '\0')) {
                  if ((uVar13 == 0) ||
                     ((lVar6 <= (long)(uVar18 + 2) || (*(char *)(lVar16 + uVar18 + 2) == '\0')))) {
LAB_00187cb4:
                    if ((uVar13 == 0) || (*(char *)(lVar16 + uVar18) == '\0')) goto LAB_00187cc4;
                    goto LAB_001879a1;
                  }
                  if ((*(char *)(lVar16 + uVar18) != '\0') && (*(char *)(lVar11 + uVar12) == '\0'))
                  {
                    uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                    goto LAB_00188b07;
                  }
                  goto LAB_00187d05;
                }
                goto LAB_001879a1;
              }
              if ((uVar18 != 0) &&
                 ((*(char *)((uVar18 - 1) + lVar14) != '\0' ||
                  (*(char *)(lVar15 + -1 + uVar18) != '\0')))) goto LAB_0018876b;
LAB_00187cc4:
              UF::P_[UF::length_] = UF::length_;
              uVar7 = UF::length_ + 1;
              *(uint *)(lVar19 + uVar18 * 4) = UF::length_;
              UF::length_ = uVar7;
            }
            else {
              uVar12 = uVar18 | 1;
              if ((long)uVar12 < lVar6) {
                if (*(char *)(lVar15 + uVar12) != '\0') {
                  if ((uVar13 == 0) || (*(char *)(lVar16 + uVar12) == '\0')) {
                    if ((uVar13 == 0) ||
                       ((lVar6 <= (long)(uVar18 + 2) || (*(char *)(lVar16 + uVar18 + 2) == '\0'))))
                    goto LAB_00187cb4;
                    if ((*(char *)(lVar16 + uVar18) != '\0') && (*(char *)(lVar11 + uVar12) == '\0')
                       ) {
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                      goto LAB_00188b07;
                    }
                    goto LAB_00187d05;
                  }
                  goto LAB_001879a1;
                }
                if ((uVar17 < uVar5) && (*(char *)(lVar14 + uVar12) != '\0')) goto LAB_00187cc4;
              }
              *(undefined4 *)(lVar19 + uVar18 * 4) = 0;
            }
          }
          else {
            if (uVar18 == 0) {
LAB_001878bc:
              uVar12 = uVar18 | 1;
              if ((uVar13 == 0) || ((lVar6 <= (long)uVar12 || (*(char *)(lVar16 + uVar12) == '\0')))
                 ) {
                if (((long)uVar12 < lVar6) &&
                   ((((*(char *)(lVar15 + uVar12) != '\0' && (uVar13 != 0)) &&
                     ((long)(uVar18 + 2) < lVar6)) && (*(char *)(lVar16 + uVar18 + 2) != '\0')))) {
                  if (*(char *)(lVar16 + uVar18) == '\0') {
                    if ((uVar18 != 0) && (*(char *)(lVar16 + -1 + uVar18) != '\0')) {
                      if (*(char *)(lVar11 + uVar12) == '\0') {
                        uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else {
                        if (*(char *)(lVar11 + uVar18) != '\0') goto LAB_00187d05;
                        uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
LAB_00188b07:
                      uVar10 = uVar7;
                      if (uVar7 < uVar9) {
                        uVar10 = uVar9;
                      }
                      if (uVar9 < uVar7) {
                        uVar7 = uVar9;
                      }
                      UF::P_[uVar10] = uVar7;
                      *(uint *)(lVar19 + uVar18 * 4) = uVar7;
                      goto LAB_00188774;
                    }
                  }
                  else if (*(char *)(lVar11 + uVar12) == '\0') {
                    uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                    goto LAB_00188b07;
                  }
LAB_00187d05:
                  uVar8 = *(undefined4 *)(lVar20 + 8 + uVar18 * 4);
                  goto LAB_00188770;
                }
                if ((uVar13 == 0) || (*(char *)(lVar16 + uVar18) == '\0')) {
                  if ((uVar13 == 0 || uVar18 == 0) || (*(char *)(lVar16 + -1 + uVar18) == '\0'))
                  goto LAB_00187cc4;
                  uVar8 = *(undefined4 *)(lVar20 + -8 + uVar18 * 4);
                  goto LAB_00188770;
                }
              }
              else if ((((*(char *)(lVar16 + uVar18) == '\0') && (uVar18 != 0)) &&
                       (*(char *)(lVar16 + -1 + uVar18) != '\0')) &&
                      (*(char *)(lVar11 + uVar18) == '\0')) {
                uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                do {
                  uVar9 = uVar7;
                  uVar7 = UF::P_[uVar9];
                  uVar10 = *(uint *)(lVar20 + uVar18 * 4);
                } while (UF::P_[uVar9] < uVar9);
                do {
                  uVar7 = uVar10;
                  uVar10 = UF::P_[uVar7];
                } while (UF::P_[uVar7] < uVar7);
                goto LAB_00188b07;
              }
LAB_001879a1:
              uVar8 = *(undefined4 *)(lVar20 + uVar18 * 4);
            }
            else {
              if (*(char *)(lVar15 + -1 + uVar18) == '\0') {
                if ((uVar17 < uVar5) && (*(char *)(lVar14 + -1 + uVar18) != '\0')) {
                  uVar12 = uVar18 | 1;
                  if (((uVar13 == 0) || (lVar6 <= (long)uVar12)) ||
                     (*(char *)(lVar16 + uVar12) == '\0')) {
                    if (((long)uVar12 < lVar6) && (*(char *)(lVar15 + uVar12) != '\0')) {
                      if (((uVar13 != 0) && ((long)(uVar18 + 2) < lVar6)) &&
                         (*(char *)(lVar16 + uVar18 + 2) != '\0')) {
                        if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                          if (*(char *)(lVar16 + uVar18) == '\0') {
                            if (*(char *)(lVar16 + -1 + uVar18) != '\0') {
                              if (*(char *)(lVar11 + uVar12) == '\0') {
                                uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                                do {
                                  uVar9 = uVar7;
                                  uVar7 = UF::P_[uVar9];
                                  uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                } while (UF::P_[uVar9] < uVar9);
                                do {
                                  uVar7 = uVar10;
                                  uVar10 = UF::P_[uVar7];
                                } while (UF::P_[uVar7] < uVar7);
                                uVar10 = uVar7;
                                if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                  uVar10 = uVar9;
                                }
                                if (uVar9 < uVar7) {
                                  uVar7 = uVar9;
                                }
                                UF::P_[uVar10] = uVar7;
                                do {
                                  uVar10 = uVar7;
                                  uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  uVar7 = puVar4[uVar10];
                                } while (puVar4[uVar10] < uVar10);
                                do {
                                  uVar7 = uVar9;
                                  uVar9 = puVar4[uVar7];
                                } while (puVar4[uVar7] < uVar7);
                              }
                              else {
                                if (*(char *)(lVar11 + uVar18) != '\0') {
                                  uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                  do {
                                    uVar9 = uVar7;
                                    uVar7 = UF::P_[uVar9];
                                    uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  } while (UF::P_[uVar9] < uVar9);
                                  do {
                                    uVar7 = uVar10;
                                    uVar10 = UF::P_[uVar7];
                                  } while (UF::P_[uVar7] < uVar7);
                                  goto LAB_00188b07;
                                }
                                uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                                do {
                                  uVar9 = uVar7;
                                  uVar7 = UF::P_[uVar9];
                                  uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                } while (UF::P_[uVar9] < uVar9);
                                do {
                                  uVar7 = uVar10;
                                  uVar10 = UF::P_[uVar7];
                                } while (UF::P_[uVar7] < uVar7);
                                uVar10 = uVar7;
                                if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                  uVar10 = uVar9;
                                }
                                if (uVar9 < uVar7) {
                                  uVar7 = uVar9;
                                }
                                UF::P_[uVar10] = uVar7;
                                do {
                                  uVar10 = uVar7;
                                  uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  uVar7 = puVar4[uVar10];
                                } while (puVar4[uVar10] < uVar10);
                                do {
                                  uVar7 = uVar9;
                                  uVar9 = puVar4[uVar7];
                                } while (puVar4[uVar7] < uVar7);
                              }
LAB_00188bc7:
                              uVar9 = uVar7;
                              if (uVar7 < uVar10) {
                                uVar9 = uVar10;
                              }
                              if (uVar10 < uVar7) {
                                uVar7 = uVar10;
                              }
                              puVar4[uVar9] = uVar7;
                              *(uint *)(lVar19 + uVar18 * 4) = uVar7;
                              goto LAB_00188774;
                            }
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else {
                            if (*(char *)(lVar11 + uVar12) == '\0') {
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                              uVar10 = uVar7;
                              if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                uVar10 = uVar9;
                              }
                              if (uVar9 < uVar7) {
                                uVar7 = uVar9;
                              }
                              UF::P_[uVar10] = uVar7;
                              do {
                                uVar10 = uVar7;
                                uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                uVar7 = puVar4[uVar10];
                              } while (puVar4[uVar10] < uVar10);
                              do {
                                uVar7 = uVar9;
                                uVar9 = puVar4[uVar7];
                              } while (puVar4[uVar7] < uVar7);
                              goto LAB_00188bc7;
                            }
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                        }
                        else if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                          if (*(char *)(lVar11 + uVar12) == '\0') {
                            if (*(char *)(lVar16 + uVar18) != '\0') {
                              if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                                uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                                do {
                                  uVar9 = uVar7;
                                  uVar7 = UF::P_[uVar9];
                                  uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                } while (UF::P_[uVar9] < uVar9);
                                do {
                                  uVar7 = uVar10;
                                  uVar10 = UF::P_[uVar7];
                                } while (UF::P_[uVar7] < uVar7);
                                uVar10 = uVar7;
                                if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                  uVar10 = uVar9;
                                }
                                if (uVar9 < uVar7) {
                                  uVar7 = uVar9;
                                }
                                UF::P_[uVar10] = uVar7;
                                do {
                                  uVar10 = uVar7;
                                  uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  uVar7 = puVar4[uVar10];
                                } while (puVar4[uVar10] < uVar10);
                                do {
                                  uVar7 = uVar9;
                                  uVar9 = puVar4[uVar7];
                                } while (puVar4[uVar7] < uVar7);
                              }
                              else {
                                if (*(char *)(lVar11 + -1 + uVar18) != '\0') {
                                  uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                  do {
                                    uVar9 = uVar7;
                                    uVar7 = UF::P_[uVar9];
                                    uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  } while (UF::P_[uVar9] < uVar9);
                                  do {
                                    uVar7 = uVar10;
                                    uVar10 = UF::P_[uVar7];
                                  } while (UF::P_[uVar7] < uVar7);
                                  goto LAB_00188b07;
                                }
                                uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                                do {
                                  uVar9 = uVar7;
                                  uVar7 = UF::P_[uVar9];
                                  uVar10 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                                } while (UF::P_[uVar9] < uVar9);
                                do {
                                  uVar7 = uVar10;
                                  uVar10 = UF::P_[uVar7];
                                } while (UF::P_[uVar7] < uVar7);
                                uVar10 = uVar7;
                                if (uVar9 >= uVar7 && uVar9 != uVar7) {
                                  uVar10 = uVar9;
                                }
                                if (uVar9 < uVar7) {
                                  uVar7 = uVar9;
                                }
                                UF::P_[uVar10] = uVar7;
                                do {
                                  uVar10 = uVar7;
                                  uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                                  uVar7 = puVar4[uVar10];
                                } while (puVar4[uVar10] < uVar10);
                                do {
                                  uVar7 = uVar9;
                                  uVar9 = puVar4[uVar7];
                                } while (puVar4[uVar7] < uVar7);
                              }
                              goto LAB_00188bc7;
                            }
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else if (*(char *)(lVar11 + -1 + uVar18) == '\0') {
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else {
                            if ((*(char *)(lVar16 + uVar18) != '\0') ||
                               (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                            uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                        }
                        else if (*(char *)(lVar11 + uVar12) == '\0') {
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        else {
                          if ((*(char *)(lVar16 + uVar18) != '\0') ||
                             (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                          uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                        }
                        goto LAB_00188b07;
                      }
                      if (uVar13 != 0) {
                        if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                          if (*(char *)(lVar16 + uVar18) != '\0') {
                            if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                            }
                            else if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                            }
                            else {
                              if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                              uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                              do {
                                uVar9 = uVar7;
                                uVar7 = UF::P_[uVar9];
                                uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                              } while (UF::P_[uVar9] < uVar9);
                              do {
                                uVar7 = uVar10;
                                uVar10 = UF::P_[uVar7];
                              } while (UF::P_[uVar7] < uVar7);
                            }
                            goto LAB_00188b07;
                          }
                        }
                        else if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                          uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                          goto LAB_00188b07;
                        }
                      }
                    }
                    else if (uVar13 != 0) {
                      if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                        if (*(char *)(lVar16 + uVar18) != '\0') {
                          if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          else {
                            if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                            uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                            do {
                              uVar9 = uVar7;
                              uVar7 = UF::P_[uVar9];
                              uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            } while (UF::P_[uVar9] < uVar9);
                            do {
                              uVar7 = uVar10;
                              uVar10 = UF::P_[uVar7];
                            } while (UF::P_[uVar7] < uVar7);
                          }
                          goto LAB_00188b07;
                        }
                      }
                      else if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                        uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                        goto LAB_00188b07;
                      }
                    }
                    goto LAB_0018876b;
                  }
                  if (*(char *)((uVar18 - 2) + lVar15) == '\0') {
                    if (*(char *)(lVar16 + uVar18) == '\0') {
                      if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                      else {
                        if (*(char *)(lVar11 + uVar18) == '\0') {
                          uVar7 = *(uint *)(lVar20 + -8 + uVar18 * 4);
                          do {
                            uVar9 = uVar7;
                            uVar7 = UF::P_[uVar9];
                            uVar10 = *(uint *)(lVar20 + uVar18 * 4);
                          } while (UF::P_[uVar9] < uVar9);
                          do {
                            uVar7 = uVar10;
                            uVar10 = UF::P_[uVar7];
                          } while (UF::P_[uVar7] < uVar7);
                          uVar10 = uVar7;
                          if (uVar9 >= uVar7 && uVar9 != uVar7) {
                            uVar10 = uVar9;
                          }
                          if (uVar9 < uVar7) {
                            uVar7 = uVar9;
                          }
                          UF::P_[uVar10] = uVar7;
                          do {
                            uVar10 = uVar7;
                            uVar9 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                            uVar7 = puVar4[uVar10];
                          } while (puVar4[uVar10] < uVar10);
                          do {
                            uVar7 = uVar9;
                            uVar9 = puVar4[uVar7];
                          } while (puVar4[uVar7] < uVar7);
                          uVar12 = (ulong)uVar7;
                          if (uVar10 >= uVar7 && uVar10 != uVar7) {
                            uVar12 = (ulong)uVar10;
                          }
                          if (uVar10 < uVar7) {
                            uVar7 = uVar10;
                          }
                          puVar4[uVar12] = uVar7;
                          *(uint *)(lVar19 + uVar18 * 4) = uVar7;
                          goto LAB_00188774;
                        }
                        uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                        do {
                          uVar9 = uVar7;
                          uVar7 = UF::P_[uVar9];
                          uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                        } while (UF::P_[uVar9] < uVar9);
                        do {
                          uVar7 = uVar10;
                          uVar10 = UF::P_[uVar7];
                        } while (UF::P_[uVar7] < uVar7);
                      }
                    }
                    else {
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                  }
                  else if (*(char *)(lVar16 + -1 + uVar18) == '\0') {
                    if (*(char *)(lVar16 + -2 + uVar18) == '\0') {
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                    else if (*(char *)(lVar11 + -1 + uVar18) == '\0') {
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                    else {
                      if ((*(char *)(lVar16 + uVar18) != '\0') ||
                         (*(char *)(lVar11 + uVar18) != '\0')) goto LAB_0018876b;
                      uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                  }
                  else {
                    if ((*(char *)(lVar16 + uVar18) != '\0') || (*(char *)(lVar11 + uVar18) != '\0')
                       ) goto LAB_0018876b;
                    uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                  }
                  goto LAB_00188b07;
                }
                goto LAB_001878bc;
              }
              uVar12 = uVar18 | 1;
              if (((uVar13 != 0) && ((long)uVar12 < lVar6)) && (*(char *)(lVar16 + uVar12) != '\0'))
              {
                if (*(char *)(lVar16 + uVar18) != '\0') goto LAB_0018876b;
                if (*(char *)(lVar11 + uVar18) == '\0') {
                  uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                  do {
                    uVar9 = uVar7;
                    uVar7 = UF::P_[uVar9];
                    uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar7 = uVar10;
                    uVar10 = UF::P_[uVar7];
                  } while (UF::P_[uVar7] < uVar7);
                }
                else {
                  if (*(char *)(lVar16 + -1 + uVar18) != '\0') goto LAB_0018876b;
                  if (*(char *)((uVar18 - 2) + lVar16) == '\0') {
                    uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                  }
                  else {
                    if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                    uVar7 = *(uint *)(lVar20 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                  }
                }
                goto LAB_00188b07;
              }
              if ((((long)uVar12 < lVar6) && (*(char *)(lVar15 + uVar12) != '\0')) &&
                 ((uVar13 != 0 &&
                  (((long)(uVar18 + 2) < lVar6 && (*(char *)(lVar16 + uVar18 + 2) != '\0')))))) {
                if (*(char *)(lVar11 + uVar12) == '\0') {
                  uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                  do {
                    uVar9 = uVar7;
                    uVar7 = UF::P_[uVar9];
                    uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                  } while (UF::P_[uVar9] < uVar9);
                  do {
                    uVar7 = uVar10;
                    uVar10 = UF::P_[uVar7];
                  } while (UF::P_[uVar7] < uVar7);
                }
                else {
                  if (*(char *)(lVar16 + uVar18) != '\0') goto LAB_0018876b;
                  if (*(char *)(lVar11 + uVar18) == '\0') {
                    uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                    do {
                      uVar9 = uVar7;
                      uVar7 = UF::P_[uVar9];
                      uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                    } while (UF::P_[uVar9] < uVar9);
                    do {
                      uVar7 = uVar10;
                      uVar10 = UF::P_[uVar7];
                    } while (UF::P_[uVar7] < uVar7);
                  }
                  else {
                    if (*(char *)(lVar16 + -1 + uVar18) != '\0') goto LAB_0018876b;
                    if (*(char *)((uVar18 - 2) + lVar16) == '\0') {
                      uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                    else {
                      if (*(char *)(lVar11 + -1 + uVar18) != '\0') goto LAB_0018876b;
                      uVar7 = *(uint *)(lVar20 + 8 + uVar18 * 4);
                      do {
                        uVar9 = uVar7;
                        uVar7 = UF::P_[uVar9];
                        uVar10 = *(uint *)(lVar19 + -8 + uVar18 * 4);
                      } while (UF::P_[uVar9] < uVar9);
                      do {
                        uVar7 = uVar10;
                        uVar10 = UF::P_[uVar7];
                      } while (UF::P_[uVar7] < uVar7);
                    }
                  }
                }
                goto LAB_00188b07;
              }
LAB_0018876b:
              uVar8 = *(undefined4 *)(lVar19 + -8 + uVar18 * 4);
            }
LAB_00188770:
            *(undefined4 *)(lVar19 + uVar18 * 4) = uVar8;
          }
LAB_00188774:
          uVar18 = uVar18 + 2;
        } while ((long)uVar18 < lVar6);
      }
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar5);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }